

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool expect_newline(FILE *filehandle,char *filepath,int32_t line_cnt)

{
  uint uVar1;
  int __c;
  
  do {
    do {
      uVar1 = fgetc((FILE *)filehandle);
    } while (uVar1 == 9);
  } while (uVar1 == 0x20);
  if ((uVar1 == 0xd) || (uVar1 == 10)) {
    do {
      __c = fgetc((FILE *)filehandle);
    } while (__c == 10);
    ungetc(__c,(FILE *)filehandle);
  }
  else {
    fprintf(_stderr,
            "%s: Parsing error at line %d. Expected newline termination (`\\n`). Found `%c` instead.\n"
            ,filepath,(ulong)(uint)line_cnt,(ulong)uVar1);
  }
  return uVar1 == 10 || uVar1 == 0xd;
}

Assistant:

static bool expect_newline(FILE *filehandle, const char *filepath,
                           int32_t line_cnt) {
    int c = ' ';
    do {
        c = fgetc(filehandle);
    } while (c == ' ' || c == '\t');

    if (c != '\r' && c != '\n') {
        fprintf(stderr,
                "%s: Parsing error at line %d. Expected newline termination "
                "(`\\n`). "
                "Found `%c` instead.\n",
                filepath, line_cnt, c);
        return false;
    }

    do {
        c = fgetc(filehandle);
    } while (c == '\n');

    ungetc(c, filehandle);
    return true;
}